

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O1

void __thiscall FxConstant::FxConstant(FxConstant *this,FString *str,FScriptPosition *pos)

{
  ExpVal local_40;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_Constant;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
  (this->value).Type = (PType *)TypeSInt32;
  (this->value).field_1.Int = 0;
  local_40.Type = (PType *)TypeString;
  (this->super_FxExpression).ValueType = (PType *)TypeString;
  FString::AttachToOther((FString *)&local_40.field_1,str);
  ExpVal::operator=(&this->value,&local_40);
  if (local_40.Type == (PType *)TypeString) {
    FString::~FString((FString *)&local_40.field_1);
  }
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(const FString &str, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = TypeString;
		value = ExpVal(str);
		isresolved = true;
	}